

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_doc(t_netstd_generator *this,ostream *out,t_function *tfunction)

{
  t_function *out_00;
  bool bVar1;
  t_struct *this_00;
  members_type *this_01;
  reference pptVar2;
  ostream *poVar3;
  string *psVar4;
  allocator local_351;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  undefined8 local_240;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  undefined8 local_230;
  char local_221;
  char *local_220;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  undefined8 local_208;
  string local_200 [8];
  string str;
  t_field *p;
  t_field **local_1d0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1c8
  ;
  const_iterator p_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  stringstream ps;
  ostream local_198;
  t_function *local_20;
  t_function *tfunction_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = tfunction;
  tfunction_local = (t_function *)out;
  out_local = (ostream *)this;
  bVar1 = t_doc::has_doc(&tfunction->super_t_doc);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&fields);
    this_00 = t_function::get_arglist(local_20);
    this_01 = t_struct::get_members(this_00);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_1c8);
    local_1d0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_01);
    local_1c8._M_current = local_1d0;
    while( true ) {
      p = (t_field *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_01);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1c8,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&p);
      out_00 = tfunction_local;
      if (!bVar1) break;
      pptVar2 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1c8);
      str.field_2._8_8_ = *pptVar2;
      poVar3 = std::operator<<(&local_198,(string *)&::endl_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"<param name=\"");
      psVar4 = t_field::get_name_abi_cxx11_((t_field *)str.field_2._8_8_);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,"\">");
      bVar1 = t_doc::has_doc((t_doc *)str.field_2._8_8_);
      if (bVar1) {
        psVar4 = t_doc::get_doc_abi_cxx11_((t_doc *)str.field_2._8_8_);
        std::__cxx11::string::string(local_200,(string *)psVar4);
        local_218._M_current = (char *)std::__cxx11::string::begin();
        local_220 = (char *)std::__cxx11::string::end();
        local_221 = '\n';
        local_210 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                              (local_218,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_220,&local_221);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_208,&local_210);
        local_238._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_230,&local_238);
        local_240 = std::__cxx11::string::erase(local_200,local_208,local_230);
        std::operator<<(&local_198,local_200);
        std::__cxx11::string::~string(local_200);
      }
      std::operator<<(&local_198,"</param>");
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_1c8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"",&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"/// ",&local_289);
    std::operator+(&local_310,"<summary>",&::endl_abi_cxx11_);
    psVar4 = t_doc::get_doc_abi_cxx11_(&local_20->super_t_doc);
    std::operator+(&local_2f0,&local_310,psVar4);
    std::operator+(&local_2d0,&local_2f0,"</summary>");
    std::__cxx11::stringstream::str();
    std::operator+(&local_2b0,&local_2d0,&local_330);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_350,"",&local_351);
    docstring_comment(this,(ostream *)out_00,&local_260,&local_288,&local_2b0,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    std::__cxx11::stringstream::~stringstream((stringstream *)&fields);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_doc(ostream& out, t_function* tfunction)
{
    if (tfunction->has_doc())
    {
        stringstream ps;
        const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
        vector<t_field*>::const_iterator p_iter;
        for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter)
        {
            t_field* p = *p_iter;
            ps << endl << "<param name=\"" << p->get_name() << "\">";
            if (p->has_doc())
            {
                string str = p->get_doc();
                str.erase(remove(str.begin(), str.end(), '\n'), str.end());
                ps << str;
            }
            ps << "</param>";
        }

        docstring_comment(out,
                                   "",
                                   "/// ",
                                   "<summary>" + endl + tfunction->get_doc() + "</summary>" + ps.str(),
                                   "");
    }
}